

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

STRING_HANDLE Map_ToJSON(MAP_HANDLE handle)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  STRING_HANDLE s2;
  STRING_HANDLE s2_00;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  STRING_HANDLE value;
  LOGGER_LOG l_2;
  STRING_HANDLE key;
  _Bool breakFor;
  MAP_HANDLE_DATA *handleData;
  size_t i;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  STRING_HANDLE result;
  MAP_HANDLE handle_local;
  
  if (handle == (MAP_HANDLE)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/map.c"
                ,"Map_ToJSON",0x262,1,"invalid arg (NULL)");
    }
  }
  else {
    l = (LOGGER_LOG)STRING_construct("{");
    if ((STRING_HANDLE)l == (STRING_HANDLE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/map.c"
                  ,"Map_ToJSON",0x26a,1,"STRING_construct failed");
      }
    }
    else {
      bVar2 = false;
      handleData = (MAP_HANDLE_DATA *)0x0;
      while( true ) {
        bVar1 = false;
        if (handleData < (MAP_HANDLE_DATA *)handle->count) {
          bVar1 = (bool)(bVar2 ^ 1);
        }
        if (!bVar1) break;
        s2 = STRING_new_JSON(handle->keys[(long)handleData]);
        if (s2 == (STRING_HANDLE)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/map.c"
                      ,"Map_ToJSON",0x279,1,"STRING_new_JSON failed");
          }
          STRING_delete((STRING_HANDLE)l);
          l = (LOGGER_LOG)0x0;
          bVar2 = true;
        }
        else {
          s2_00 = STRING_new_JSON(handle->values[(long)handleData]);
          if (s2_00 == (STRING_HANDLE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/map.c"
                        ,"Map_ToJSON",0x283,1,"STRING_new_JSON failed");
            }
            STRING_delete((STRING_HANDLE)l);
            l = (LOGGER_LOG)0x0;
            bVar2 = true;
          }
          else {
            if ((((handleData != (MAP_HANDLE_DATA *)0x0) &&
                 (iVar3 = STRING_concat((STRING_HANDLE)l,","), iVar3 != 0)) ||
                (iVar3 = STRING_concat_with_STRING((STRING_HANDLE)l,s2), iVar3 != 0)) ||
               ((iVar3 = STRING_concat((STRING_HANDLE)l,":"), iVar3 != 0 ||
                (iVar3 = STRING_concat_with_STRING((STRING_HANDLE)l,s2_00), iVar3 != 0)))) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/map.c"
                          ,"Map_ToJSON",0x291,1,"failed to build the JSON");
              }
              STRING_delete((STRING_HANDLE)l);
              l = (LOGGER_LOG)0x0;
              bVar2 = true;
            }
            STRING_delete(s2_00);
          }
          STRING_delete(s2);
        }
        handleData = (MAP_HANDLE_DATA *)((long)&handleData->keys + 1);
      }
      if (bVar2) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/map.c"
                    ,"Map_ToJSON",0x2a2,1,"error happened during JSON string builder");
        }
      }
      else {
        iVar3 = STRING_concat((STRING_HANDLE)l,"}");
        if (iVar3 != 0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/map.c"
                      ,"Map_ToJSON",0x2a8,1,"failed to build the JSON");
          }
          STRING_delete((STRING_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
    }
  }
  return (STRING_HANDLE)l;
}

Assistant:

STRING_HANDLE Map_ToJSON(MAP_HANDLE handle)
{
    STRING_HANDLE result;
    /*Codes_SRS_MAP_02_052: [If parameter handle is NULL then Map_ToJSON shall return NULL.] */
    if (handle == NULL)
    {
        result = NULL;
        LogError("invalid arg (NULL)");
    }
    else
    {
        /*Codes_SRS_MAP_02_048: [Map_ToJSON shall produce a STRING_HANDLE representing the content of the MAP.] */
        result = STRING_construct("{");
        if (result == NULL)
        {
            LogError("STRING_construct failed");
        }
        else
        {
            size_t i;
            MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA *)handle;
            /*Codes_SRS_MAP_02_049: [If the MAP is empty, then Map_ToJSON shall produce the string "{}".*/
            bool breakFor = false; /*used to break out of for*/
            for (i = 0; (i < handleData->count) && (!breakFor); i++)
            {
                /*add one entry to the JSON*/
                /*Codes_SRS_MAP_02_050: [If the map has properties then Map_ToJSON shall produce the following string:{"name1":"value1", "name2":"value2" ...}]*/
                STRING_HANDLE key = STRING_new_JSON(handleData->keys[i]);
                if (key == NULL)
                {
                    LogError("STRING_new_JSON failed");
                    STRING_delete(result);
                    result = NULL;
                    breakFor = true;
                }
                else
                {
                    STRING_HANDLE value = STRING_new_JSON(handleData->values[i]);
                    if (value == NULL)
                    {
                        LogError("STRING_new_JSON failed");
                        STRING_delete(result);
                        result = NULL;
                        breakFor = true;
                    }
                    else
                    {
                        if (!(
                            ((i>0) ? (STRING_concat(result, ",") == 0) : 1) &&
                            (STRING_concat_with_STRING(result, key) == 0) &&
                            (STRING_concat(result, ":") == 0) &&
                            (STRING_concat_with_STRING(result, value) == 0)
                            ))
                        {
                            LogError("failed to build the JSON");
                            STRING_delete(result);
                            result = NULL;
                            breakFor = true;
                        }
                        else
                        {
                            /*all nice, go to the next element in the map*/
                        }
                        STRING_delete(value);
                    }
                    STRING_delete(key);
                }
            }

            if (breakFor)
            {
                LogError("error happened during JSON string builder");
            }
            else
            {
                if (STRING_concat(result, "}") != 0)
                {
                    LogError("failed to build the JSON");
                    STRING_delete(result);
                    result = NULL;
                }
                else
                {
                    /*return as is, JSON has been build*/
                }
            }
        }
    }
    return result;

}